

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::TestCase::hasTag(TestCase *this,string *tag)

{
  bool bVar1;
  _Self local_58 [3];
  Catch local_40 [32];
  _Self local_20;
  string *local_18;
  string *tag_local;
  TestCase *this_local;
  
  local_18 = tag;
  tag_local = (string *)this;
  toLower(local_40,tag);
  local_20._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::find(&(this->super_TestCaseInfo).tags,(key_type *)local_40);
  local_58[0]._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&(this->super_TestCaseInfo).tags);
  bVar1 = std::operator!=(&local_20,local_58);
  std::__cxx11::string::~string((string *)local_40);
  return bVar1;
}

Assistant:

bool TestCase::hasTag( std::string const& tag ) const {
        return tags.find( toLower( tag ) ) != tags.end();
    }